

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_CopyRectIn_Test::TestBody(Image_CopyRectIn_Test *this)

{
  PixelFormat format;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Point2i PVar3;
  pointer pbVar4;
  long lVar5;
  Allocator alloc;
  int iVar6;
  float *pfVar7;
  pointer pfVar8;
  pointer pfVar9;
  int nc;
  char *pcVar10;
  ColorEncodingHandle *encoding;
  long lVar11;
  int x;
  ulong uVar12;
  int c;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar15;
  Float FVar16;
  Bounds2iIterator BVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> buf_00;
  Float qv;
  AssertHelper local_248;
  AssertionResult gtest_ar_;
  int local_230;
  AssertionResult gtest_ar;
  Bounds2iIterator pIter;
  vector<float,_std::allocator<float>_> buf;
  Bounds2i extent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  WrapMode2D local_1a0;
  WrapMode2D local_198;
  ColorEncodingHandle local_190;
  PixelFormat local_184 [3];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  RNG rng;
  Image image;
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  local_184[0] = U256;
  local_184[1] = Half;
  lVar5 = 0;
  local_184[2] = 2;
  do {
    if (lVar5 == 0xc) {
      return;
    }
    format = *(PixelFormat *)((long)local_184 + lVar5);
    local_230 = 0;
    for (nc = 1; nc != 4; nc = nc + 1) {
      GetFloatPixels(&orig,(Point2i)0x2000000011,nc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&image,"A",(allocator<char> *)&gtest_ar);
      __l._M_len = 1;
      __l._M_array = (iterator)&image;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&channelNames,__l,(allocator_type *)&buf);
      std::__cxx11::string::~string((string *)&image);
      iVar6 = local_230;
      while (pbVar4 = channelNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, bVar13 = iVar6 != 0,
            iVar6 = iVar6 + -1, bVar13) {
        image._0_8_ = &image.channelNames;
        std::__cxx11::string::_M_construct((ulong)&image,'\x01');
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &channelNames,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image);
        std::__cxx11::string::~string((string *)&image);
      }
      lVar11 = (long)channelNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)channelNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_190.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )pbrt::ColorEncodingHandle::Linear.bits;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      encoding = &local_190;
      channels.n = lVar11 >> 5;
      channels.ptr = pbVar4;
      pbrt::Image::Image(&image,format,(Point2i)0x2000000011,channels,encoding,alloc);
      pfVar7 = orig.ptr;
      for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
        for (uVar12 = 0; uVar12 != 0x11; uVar12 = uVar12 + 1) {
          for (iVar6 = 0; nc != iVar6; iVar6 = iVar6 + 1) {
            pbrt::Image::SetChannel(&image,(Point2i)(lVar11 << 0x20 | uVar12),iVar6,*pfVar7);
            pfVar7 = pfVar7 + 1;
          }
        }
      }
      extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 10;
      extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0x17;
      extent.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0x11;
      extent.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0x1c;
      std::vector<float,_std::allocator<float>_>::vector
                (&buf,(long)(nc * 0x23),(allocator_type *)&gtest_ar);
      pfVar9 = buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      for (pfVar8 = buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start; pfVar8 != pfVar9; pfVar8 = pfVar8 + 1) {
        fVar15 = pbrt::RNG::Uniform<float>(&rng);
        *pfVar8 = fVar15;
      }
      buf_00.n = (long)buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      buf_00.ptr = buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      pbrt::Image::CopyRectIn(&image,&extent,buf_00);
      pIter.p.super_Tuple2<pbrt::Point2,_int> = extent.pMin.super_Tuple2<pbrt::Point2,_int>;
      pfVar9 = buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
               ._M_start;
      pIter.bounds = &extent;
      while( true ) {
        BVar17 = pbrt::end(&extent);
        if (((pIter.p.super_Tuple2<pbrt::Point2,_int>.x ==
              BVar17.p.super_Tuple2<pbrt::Point2,_int>.x) &&
            (pIter.p.super_Tuple2<pbrt::Point2,_int>.y == BVar17.p.super_Tuple2<pbrt::Point2,_int>.y
            )) && (pIter.bounds == BVar17.bounds)) break;
        for (iVar6 = 0; nc != iVar6; iVar6 = iVar6 + 1) {
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ =
               pfVar9 != buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish;
          if (pfVar9 == buf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            testing::Message::Message((Message *)&local_248);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"bufIter == buf.end()","true","false",(char *)encoding);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&qv,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0x121,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=((AssertHelper *)&qv,(Message *)&local_248);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qv);
            std::__cxx11::string::~string((string *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_248);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar_.message_);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&buf.super__Vector_base<float,_std::allocator<float>_>);
            pbrt::Image::~Image(&image);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&channelNames);
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&orig);
            return;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          PVar3 = pIter.p;
          if (format == U256) {
            pbrt::WrapMode2D::WrapMode2D(&local_198,Clamp);
            FVar16 = pbrt::Image::GetChannel(&image,PVar3,iVar6,local_198);
            gtest_ar_.success_ = true;
            gtest_ar_._1_3_ = 0x3b00c2;
            auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)*pfVar9));
            uVar1 = vcmpss_avx512f(ZEXT416((uint)*pfVar9),ZEXT816(0) << 0x40,1);
            auVar2._8_4_ = 0x7fffffff;
            auVar2._0_8_ = 0x7fffffff7fffffff;
            auVar2._12_4_ = 0x7fffffff;
            auVar14 = vandps_avx512vl(ZEXT416((uint)(FVar16 - (float)((uint)!(bool)((byte)uVar1 & 1)
                                                                     * auVar14._0_4_))),auVar2);
            qv = auVar14._0_4_;
            testing::internal::CmpHelperLT<float,float>
                      ((internal *)&gtest_ar,"err","0.501f / 255.f",&qv,(float *)&gtest_ar_);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              pcVar10 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_248,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x125,pcVar10);
              testing::internal::AssertHelper::operator=(&local_248,(Message *)&gtest_ar_);
              goto LAB_003458fd;
            }
          }
          else {
            qv = modelQuantization(*pfVar9,format);
            PVar3 = pIter.p;
            pbrt::WrapMode2D::WrapMode2D(&local_1a0,Clamp);
            gtest_ar_._0_4_ = pbrt::Image::GetChannel(&image,PVar3,iVar6,local_1a0);
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&gtest_ar,"qv","image.GetChannel(*pIter, c)",&qv,
                       (float *)&gtest_ar_);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              pcVar10 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_248,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x128,pcVar10);
              testing::internal::AssertHelper::operator=(&local_248,(Message *)&gtest_ar_);
LAB_003458fd:
              testing::internal::AssertHelper::~AssertHelper(&local_248);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_);
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          pfVar9 = pfVar9 + 1;
        }
        pbrt::Bounds2iIterator::operator++(&pIter);
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&buf.super__Vector_base<float,_std::allocator<float>_>);
      pbrt::Image::~Image(&image);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&channelNames);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&orig);
      local_230 = local_230 + 1;
    }
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

TEST(Image, CopyRectIn) {
    Point2i res(17, 32);
    RNG rng;

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);
            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(10, 23), Point2i(17, 28));
            std::vector<float> buf(extent.Area() * nc);
            std::generate(buf.begin(), buf.end(),
                          [&rng]() { return rng.Uniform<Float>(); });

            image.CopyRectIn(extent, buf);

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    if (format == PixelFormat::U256) {
                        Float err =
                            std::abs(image.GetChannel(*pIter, c) - Clamp(*bufIter, 0, 1));
                        EXPECT_LT(err, 0.501f / 255.f);
                    } else {
                        Float qv = modelQuantization(*bufIter, format);
                        EXPECT_EQ(qv, image.GetChannel(*pIter, c));
                    }
                    ++bufIter;
                }
            }
        }
    }
}